

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O1

mz_bool duckdb_miniz::mz_zip_writer_add_from_zip_reader
                  (mz_zip_archive *pZip,mz_zip_archive *pSource_zip,mz_uint src_file_index)

{
  int iVar1;
  int iVar2;
  mz_zip_internal_state *pArray;
  mz_zip_internal_state *pmVar3;
  undefined8 uVar4;
  bool bVar5;
  uint uVar6;
  mz_bool mVar7;
  int iVar8;
  size_t sVar9;
  short *psVar10;
  int *piVar11;
  mz_uint8 *pmVar12;
  void *pvVar13;
  uint uVar14;
  mz_uint8 *pmVar15;
  mz_uint8 *pmVar16;
  void *pvVar17;
  short *psVar18;
  mz_uint64 mVar19;
  ulong uVar20;
  int *pCentral_dir_header;
  ulong uVar21;
  uint uVar22;
  size_t new_capacity;
  mz_zip_array new_ext_block;
  mz_uint64 local_dir_header_ofs;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat src_file_stat;
  mz_uint64 mVar23;
  mz_uint32 *pDisk_start;
  uint local_54c;
  void *local_548;
  mz_uint8 *local_540;
  mz_uint8 *local_538;
  undefined8 local_530;
  uint local_524;
  ulong local_520;
  mz_zip_array local_518;
  short *local_4f8;
  mz_uint64 local_4f0;
  int local_4e8;
  byte local_4e2;
  int local_4d6;
  int local_4d2;
  ushort local_4ce;
  ushort local_4cc;
  ulong local_4c8;
  ulong local_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined4 uStack_4a8;
  undefined4 local_4a4;
  undefined4 uStack_4a0;
  undefined2 uStack_49c;
  undefined2 local_49a;
  undefined6 uStack_498;
  undefined4 uStack_492;
  undefined4 uStack_48e;
  mz_zip_archive_file_stat local_480;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pArray = pZip->m_pState;
  if (((pArray == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) ||
     (pSource_zip->m_pRead == (mz_file_read_func)0x0)) {
    if (pZip == (mz_zip_archive *)0x0) {
      return 0;
    }
LAB_01208a4a:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  pmVar3 = pSource_zip->m_pState;
  if ((pmVar3->m_zip64 != 0) && (pArray->m_zip64 == 0)) goto LAB_01208a4a;
  if ((pmVar3 == (mz_zip_internal_state *)0x0 || pSource_zip == (mz_zip_archive *)0x0) ||
     (pSource_zip->m_total_files <= src_file_index)) {
    pCentral_dir_header = (int *)0x0;
  }
  else {
    pCentral_dir_header =
         (int *)((ulong)*(uint *)((long)(pmVar3->m_central_dir_offsets).m_p +
                                 (ulong)src_file_index * 4) + (long)(pmVar3->m_central_dir).m_p);
  }
  if (pCentral_dir_header == (int *)0x0) {
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if (*pCentral_dir_header != 0x2014b50) {
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  local_520 = (ulong)*(ushort *)(pCentral_dir_header + 7);
  local_4c0 = (ulong)*(ushort *)(pCentral_dir_header + 8);
  local_524 = (uint)*(ushort *)((long)pCentral_dir_header + 0x1e);
  local_548 = (void *)(ulong)((uint)*(ushort *)(pCentral_dir_header + 8) +
                              (uint)*(ushort *)(pCentral_dir_header + 7) + local_524);
  if ((long)local_548 + ((pArray->m_central_dir).m_size - 0xffffffb1) < 0xffffffff00000001) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
    return 0;
  }
  if (pZip->m_file_offset_alignment == 0) {
    uVar6 = 0;
  }
  else {
    iVar8 = (int)pZip->m_file_offset_alignment;
    uVar6 = iVar8 - 1;
    uVar6 = iVar8 - ((uint)pZip->m_archive_size & uVar6) & uVar6;
  }
  if (pArray->m_zip64 == 0) {
    if (pZip->m_total_files == 0xffff) goto LAB_01208cb7;
  }
  else if (pZip->m_total_files == 0xffffffff) {
LAB_01208cb7:
    pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
    return 0;
  }
  mVar7 = mz_zip_file_stat_internal
                    (pSource_zip,src_file_index,(mz_uint8 *)pCentral_dir_header,&local_480,
                     (mz_bool *)0x0);
  if (mVar7 == 0) {
    return 0;
  }
  local_540 = (mz_uint8 *)pZip->m_archive_size;
  mVar23 = local_480.m_local_header_ofs;
  sVar9 = (*pSource_zip->m_pRead)
                    (pSource_zip->m_pIO_opaque,local_480.m_local_header_ofs,&local_4e8,0x1e);
  if (sVar9 != 0x1e) {
LAB_01209109:
    pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
    return 0;
  }
  if (local_4e8 != 0x4034b50) {
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  local_538 = (mz_uint8 *)(((uint)local_4cc + (uint)local_4ce) + local_480.m_comp_size);
  local_530 = 0;
  if ((local_4cc != 0) && ((local_4d6 == -1 || (local_4d2 == -1)))) {
    uVar20 = (ulong)local_4cc;
    local_530 = 0;
    local_4c8 = (ulong)local_4cc;
    psVar10 = (short *)(*pZip->m_pRealloc)(pZip->m_pAlloc_opaque,(void *)0x0,1,uVar20);
    if (psVar10 == (short *)0x0) {
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      bVar5 = false;
    }
    else {
      local_4f8 = psVar10;
      sVar9 = (*pSource_zip->m_pRead)
                        (pSource_zip->m_pIO_opaque,local_4ce + local_480.m_local_header_ofs + 0x1e,
                         psVar10,uVar20);
      if (sVar9 == uVar20) {
        local_530 = 0;
        psVar10 = local_4f8;
        psVar18 = local_4f8;
        uVar20 = local_4c8;
        do {
          uVar22 = (uint)uVar20;
          if (uVar22 < 4) {
LAB_01208c56:
            (*pZip->m_pFree)(pZip->m_pAlloc_opaque,psVar10);
            pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
            iVar8 = 1;
            psVar10 = (short *)0x0;
LAB_01208c75:
            bVar5 = false;
          }
          else {
            uVar14 = (ushort)psVar18[1] + 4;
            if (uVar22 < uVar14) goto LAB_01208c56;
            if (*psVar18 == 1) {
              if ((ushort)psVar18[1] < 0x10) goto LAB_01208c56;
              local_530 = 1;
              iVar8 = 2;
              goto LAB_01208c75;
            }
            psVar18 = (short *)((long)psVar18 + (ulong)uVar14);
            iVar8 = 0;
            bVar5 = true;
            uVar20 = (ulong)(uVar22 - uVar14);
          }
          if (iVar8 != 0) {
            if (iVar8 != 2) goto LAB_01208d08;
            break;
          }
        } while ((int)uVar20 != 0);
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,psVar10);
        bVar5 = true;
      }
      else {
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4f8);
        pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
        bVar5 = false;
        local_530 = 0;
      }
    }
LAB_01208d08:
    if (!bVar5) {
      return 0;
    }
  }
  if ((pArray->m_zip64 == 0) &&
     ((mz_uint8 *)0xfffffffe <
      local_538 +
      (long)local_548 + (pArray->m_central_dir).m_size + (long)local_540 + (ulong)uVar6 + 0xb2)) {
    pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
    return 0;
  }
  mVar7 = mz_zip_writer_write_zeros(pZip,(mz_uint64)local_540,uVar6);
  if (mVar7 == 0) {
    return 0;
  }
  mVar19 = (long)local_540 + (ulong)uVar6;
  local_4f0 = mVar19;
  sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar19,&local_4e8,0x1e);
  pmVar12 = local_538;
  if (sVar9 != 0x1e) {
LAB_012093db:
    pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
    return 0;
  }
  pmVar16 = (mz_uint8 *)0x10000;
  if (local_538 < (mz_uint8 *)0x10000) {
    pmVar16 = local_538;
  }
  pmVar15 = (mz_uint8 *)0x20;
  if ((mz_uint8 *)0x20 < pmVar16) {
    pmVar15 = pmVar16;
  }
  local_540 = (mz_uint8 *)mVar19;
  piVar11 = (int *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,(size_t)pmVar15);
  if (piVar11 == (int *)0x0) goto LAB_01209453;
  pmVar16 = (mz_uint8 *)(mVar23 + 0x1e);
  local_540 = (mz_uint8 *)((long)local_540 + 0x1e);
  if (pmVar12 == (mz_uint8 *)0x0) {
    pmVar15 = (mz_uint8 *)(ulong)local_54c;
  }
  else {
    do {
      pmVar15 = (mz_uint8 *)0x10000;
      if (pmVar12 < (mz_uint8 *)0x10000) {
        pmVar15 = pmVar12;
      }
      local_538 = pmVar12;
      pmVar12 = (mz_uint8 *)
                (*pSource_zip->m_pRead)
                          (pSource_zip->m_pIO_opaque,(mz_uint64)pmVar16,piVar11,(size_t)pmVar15);
      local_54c = (uint)pmVar15;
      if (pmVar12 != pmVar15) goto LAB_012090fd;
      pmVar12 = (mz_uint8 *)
                (*pZip->m_pWrite)(pZip->m_pIO_opaque,(mz_uint64)local_540,piVar11,(size_t)pmVar15);
      if (pmVar12 != pmVar15) goto LAB_012093cf;
      pmVar16 = pmVar16 + (long)pmVar15;
      local_540 = local_540 + (long)pmVar15;
      pmVar12 = local_538 + -(long)pmVar15;
    } while (pmVar12 != (mz_uint8 *)0x0);
  }
  local_54c = (uint)pmVar15;
  if ((local_4e2 & 8) != 0) {
    if ((int)local_530 == 0 && pSource_zip->m_pState->m_zip64 == 0) {
      sVar9 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,(mz_uint64)pmVar16,piVar11,0x10);
      if (sVar9 == 0x10) {
        if (pZip->m_pState->m_zip64 == 0) {
          local_54c = (uint)(*piVar11 == 0x8074b50) * 4 + 0xc;
        }
        else {
          uVar20 = (ulong)(*piVar11 == 0x8074b50);
          iVar8 = piVar11[uVar20];
          iVar1 = piVar11[uVar20 + 1];
          iVar2 = piVar11[uVar20 + 2];
          *piVar11 = 0x8074b50;
          *(char *)(piVar11 + 1) = (char)iVar8;
          *(char *)((long)piVar11 + 5) = (char)((uint)iVar8 >> 8);
          *(char *)((long)piVar11 + 6) = (char)((uint)iVar8 >> 0x10);
          *(char *)((long)piVar11 + 7) = (char)((uint)iVar8 >> 0x18);
          *(char *)(piVar11 + 2) = (char)iVar1;
          *(char *)((long)piVar11 + 9) = (char)((uint)iVar1 >> 8);
          *(char *)((long)piVar11 + 10) = (char)((uint)iVar1 >> 0x10);
          *(char *)((long)piVar11 + 0xb) = (char)((uint)iVar1 >> 0x18);
          piVar11[3] = 0;
          *(char *)(piVar11 + 4) = (char)iVar2;
          *(char *)((long)piVar11 + 0x11) = (char)((uint)iVar2 >> 8);
          *(char *)((long)piVar11 + 0x12) = (char)((uint)iVar2 >> 0x10);
          *(char *)((long)piVar11 + 0x13) = (char)((uint)iVar2 >> 0x18);
          piVar11[5] = 0;
          local_54c = 0x18;
        }
      }
      else {
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar11);
        pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
      }
      if (sVar9 != 0x10) {
        return 0;
      }
    }
    else {
      sVar9 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,(mz_uint64)pmVar16,piVar11,0x18);
      if (sVar9 != 0x18) {
LAB_012090fd:
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar11);
        goto LAB_01209109;
      }
      local_54c = (uint)(*piVar11 == 0x8074b50) * 4 + 0x14;
    }
    uVar20 = (ulong)local_54c;
    sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,(mz_uint64)local_540,piVar11,uVar20);
    if (sVar9 != uVar20) {
LAB_012093cf:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar11);
      goto LAB_012093db;
    }
    local_540 = local_540 + uVar20;
  }
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar11);
  pDisk_start = (mz_uint32 *)(pArray->m_central_dir).m_size;
  local_4b8 = *(undefined8 *)pCentral_dir_header;
  uStack_4b0 = *(undefined8 *)(pCentral_dir_header + 2);
  uVar4 = *(undefined8 *)(pCentral_dir_header + 6);
  uStack_498 = (undefined6)((ulong)*(undefined8 *)((long)pCentral_dir_header + 0x1e) >> 0x10);
  uStack_4a8 = (undefined4)*(undefined8 *)(pCentral_dir_header + 4);
  local_4a4 = (undefined4)((ulong)*(undefined8 *)(pCentral_dir_header + 4) >> 0x20);
  uStack_4a0 = (undefined4)uVar4;
  uStack_49c = (undefined2)((ulong)uVar4 >> 0x20);
  local_49a = (undefined2)((ulong)uVar4 >> 0x30);
  uStack_492 = (undefined4)*(undefined8 *)((long)pCentral_dir_header + 0x26);
  if (pArray->m_zip64 == 0) {
    if (((ulong)local_540 >> 0x20 != 0) || (0xfffffffe < local_4f0)) {
      pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      return 0;
    }
    _uStack_492 = CONCAT44((int)local_4f0,uStack_492);
    uVar20 = (long)pDisk_start + 0x2e;
    if (((pArray->m_central_dir).m_capacity < uVar20) &&
       (mVar7 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar20,1), mVar7 == 0))
    goto LAB_01209453;
    (pArray->m_central_dir).m_size = uVar20;
    uVar20 = (ulong)(pArray->m_central_dir).m_element_size;
    switchD_00b1522a::default
              ((void *)((long)pDisk_start * uVar20 + (long)(pArray->m_central_dir).m_p),&local_4b8,
               uVar20 * 0x2e);
    sVar9 = (pArray->m_central_dir).m_size;
    uVar20 = sVar9 + (long)local_548;
    if ((uVar20 <= (pArray->m_central_dir).m_capacity) ||
       (mVar7 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar20,1), mVar7 != 0)) {
      (pArray->m_central_dir).m_size = uVar20;
      uVar20 = (ulong)(pArray->m_central_dir).m_element_size;
      switchD_00b1522a::default
                ((void *)(sVar9 * uVar20 + (long)(pArray->m_central_dir).m_p),
                 (void *)((long)pCentral_dir_header + 0x2e),(long)local_548 * uVar20);
LAB_012092c4:
      if (0xfffffffe < (pArray->m_central_dir).m_size) {
        if ((mz_uint32 *)(pArray->m_central_dir).m_capacity < pDisk_start) {
          pvVar13 = (*pZip->m_pRealloc)(pZip->m_pAlloc_opaque,(pArray->m_central_dir).m_p,
                                        (ulong)(pArray->m_central_dir).m_element_size,
                                        (size_t)pDisk_start);
          if (pvVar13 == (void *)0x0) goto LAB_01209307;
          (pArray->m_central_dir).m_p = pvVar13;
          (pArray->m_central_dir).m_capacity = (size_t)pDisk_start;
        }
        (pArray->m_central_dir).m_size = (size_t)pDisk_start;
LAB_01209307:
        pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
        return 0;
      }
      local_54c = (uint)pDisk_start;
      sVar9 = (pArray->m_central_dir_offsets).m_size;
      uVar20 = sVar9 + 1;
      if ((uVar20 <= (pArray->m_central_dir_offsets).m_capacity) ||
         (mVar7 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar20,1),
         mVar7 != 0)) {
        (pArray->m_central_dir_offsets).m_size = uVar20;
        uVar20 = (ulong)(pArray->m_central_dir_offsets).m_element_size;
        switchD_00b1522a::default
                  ((void *)(sVar9 * uVar20 + (long)(pArray->m_central_dir_offsets).m_p),&local_54c,
                   uVar20);
        pZip->m_total_files = pZip->m_total_files + 1;
        pZip->m_archive_size = (mz_uint64)local_540;
        return 1;
      }
    }
  }
  else {
    local_548 = (void *)(local_520 & 0xffffffff);
    local_538 = (mz_uint8 *)((long)local_548 + (long)pCentral_dir_header + 0x2e);
    local_518.m_capacity = 0;
    local_518.m_p = (void *)0x0;
    local_518.m_size = 0;
    local_518.m_element_size = 1;
    local_518._28_4_ = 0;
    local_4a4 = 0xffffffff;
    uStack_4a0 = 0xffffffff;
    _uStack_492 = CONCAT44(0xffffffff,uStack_492);
    mVar7 = mz_zip_writer_update_zip64_extension_block
                      (&local_518,pZip,local_538,local_524,&local_480.m_comp_size,
                       &local_480.m_uncomp_size,&local_4f0,pDisk_start);
    if (mVar7 == 0) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_518.m_p);
      return 0;
    }
    local_520 = local_518.m_size;
    local_49a = (undefined2)local_518.m_size;
    sVar9 = (pArray->m_central_dir).m_size;
    uVar20 = sVar9 + 0x2e;
    if (((pArray->m_central_dir).m_capacity < uVar20) &&
       (mVar7 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar20,1), mVar7 == 0)) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_518.m_p);
      goto LAB_01209453;
    }
    (pArray->m_central_dir).m_size = uVar20;
    uVar20 = (ulong)(pArray->m_central_dir).m_element_size;
    switchD_00b1522a::default
              ((void *)(sVar9 * uVar20 + (long)(pArray->m_central_dir).m_p),&local_4b8,uVar20 * 0x2e
              );
    sVar9 = (pArray->m_central_dir).m_size;
    uVar20 = (long)local_548 + sVar9;
    if (((pArray->m_central_dir).m_capacity < uVar20) &&
       (mVar7 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar20,1), mVar7 == 0)) {
      pvVar13 = pZip->m_pAlloc_opaque;
      pvVar17 = local_518.m_p;
    }
    else {
      (pArray->m_central_dir).m_size = uVar20;
      uVar20 = (ulong)(pArray->m_central_dir).m_element_size;
      switchD_00b1522a::default
                ((void *)(sVar9 * uVar20 + (long)(pArray->m_central_dir).m_p),
                 (void *)((long)pCentral_dir_header + 0x2e),(long)local_548 * uVar20);
      local_548 = local_518.m_p;
      sVar9 = (pArray->m_central_dir).m_size;
      uVar20 = local_520 + sVar9;
      if ((uVar20 <= (pArray->m_central_dir).m_capacity) ||
         (mVar7 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar20,1), mVar7 != 0)) {
        (pArray->m_central_dir).m_size = uVar20;
        uVar20 = (ulong)(pArray->m_central_dir).m_element_size;
        switchD_00b1522a::default
                  ((void *)(sVar9 * uVar20 + (long)(pArray->m_central_dir).m_p),local_548,
                   local_520 * uVar20);
        uVar21 = local_4c0 & 0xffffffff;
        sVar9 = (pArray->m_central_dir).m_size;
        uVar20 = sVar9 + uVar21;
        if ((uVar20 <= (pArray->m_central_dir).m_capacity) ||
           (mVar7 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar20,1), mVar7 != 0))
        {
          (pArray->m_central_dir).m_size = uVar20;
          uVar20 = (ulong)(pArray->m_central_dir).m_element_size;
          switchD_00b1522a::default
                    ((void *)(sVar9 * uVar20 + (long)(pArray->m_central_dir).m_p),
                     local_538 + local_524,uVar21 * uVar20);
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_548);
          goto LAB_012092c4;
        }
      }
      pvVar13 = pZip->m_pAlloc_opaque;
      pvVar17 = local_548;
    }
    (*pZip->m_pFree)(pvVar13,pvVar17);
    local_518.m_capacity = 0;
    local_518.m_element_size = 0;
    local_518._28_4_ = 0;
    local_518.m_p = (void *)0x0;
    local_518.m_size = 0;
  }
  if ((mz_uint32 *)(pArray->m_central_dir).m_capacity < pDisk_start) {
    pvVar13 = (*pZip->m_pRealloc)(pZip->m_pAlloc_opaque,(pArray->m_central_dir).m_p,
                                  (ulong)(pArray->m_central_dir).m_element_size,(size_t)pDisk_start)
    ;
    if (pvVar13 == (void *)0x0) goto LAB_01209453;
    (pArray->m_central_dir).m_p = pvVar13;
    (pArray->m_central_dir).m_capacity = (size_t)pDisk_start;
  }
  (pArray->m_central_dir).m_size = (size_t)pDisk_start;
LAB_01209453:
  pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *pZip, mz_zip_archive *pSource_zip, mz_uint src_file_index)
{
    mz_uint n, bit_flags, num_alignment_padding_bytes, src_central_dir_following_data_size;
    mz_uint64 src_archive_bytes_remaining, local_dir_header_ofs;
    mz_uint64 cur_src_file_ofs, cur_dst_file_ofs;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
    mz_uint8 new_central_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];
    size_t orig_central_dir_size;
    mz_zip_internal_state *pState;
    void *pBuf;
    const mz_uint8 *pSrc_central_header;
    mz_zip_archive_file_stat src_file_stat;
    mz_uint32 src_filename_len, src_comment_len, src_ext_len;
    mz_uint32 local_header_filename_size, local_header_extra_len;
    mz_uint64 local_header_comp_size, local_header_uncomp_size;
    mz_bool found_zip64_ext_data_in_ldir = MZ_FALSE;

    /* Sanity checks */
    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pSource_zip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    /* Don't support copying files from zip64 archives to non-zip64, even though in some cases this is possible */
    if ((pSource_zip->m_pState->m_zip64) && (!pZip->m_pState->m_zip64))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* Get pointer to the source central dir header and crack it */
    if (NULL == (pSrc_central_header = mz_zip_get_cdh(pSource_zip, src_file_index)))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_SIG_OFS) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    src_filename_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    src_comment_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_COMMENT_LEN_OFS);
    src_ext_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS);
    src_central_dir_following_data_size = src_filename_len + src_ext_len + src_comment_len;

    /* TODO: We don't support central dir's >= MZ_UINT32_MAX bytes right now (+32 fudge factor in case we need to add more extra data) */
    if ((pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + 32) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    if (!pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        /* TODO: Our zip64 support still has some 32-bit limits that may not be worth fixing. */
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }

    if (!mz_zip_file_stat_internal(pSource_zip, src_file_index, pSrc_central_header, &src_file_stat, NULL))
        return MZ_FALSE;

    cur_src_file_ofs = src_file_stat.m_local_header_ofs;
    cur_dst_file_ofs = pZip->m_archive_size;

    /* Read the source archive's local dir header */
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    cur_src_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Compute the total size we need to copy (filename+extra data+compressed data) */
    local_header_filename_size = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS);
    local_header_extra_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    local_header_comp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS);
    local_header_uncomp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS);
    src_archive_bytes_remaining = local_header_filename_size + local_header_extra_len + src_file_stat.m_comp_size;

    /* Try to find a zip64 extended information field */
    if ((local_header_extra_len) && ((local_header_comp_size == MZ_UINT32_MAX) || (local_header_uncomp_size == MZ_UINT32_MAX)))
    {
        mz_zip_array file_data_array;
        const mz_uint8 *pExtra_data;
        mz_uint32 extra_size_remaining = local_header_extra_len;

        mz_zip_array_init(&file_data_array, 1);
        if (!mz_zip_array_resize(pZip, &file_data_array, local_header_extra_len, MZ_FALSE))
        {
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, src_file_stat.m_local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_size, file_data_array.m_p, local_header_extra_len) != local_header_extra_len)
        {
            mz_zip_array_clear(pZip, &file_data_array);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }

        pExtra_data = (const mz_uint8 *)file_data_array.m_p;

        do
        {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2))
            {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining)
            {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
            {
                const mz_uint8 *pSrc_field_data = pExtra_data + sizeof(mz_uint32);

                if (field_data_size < sizeof(mz_uint64) * 2)
                {
                    mz_zip_array_clear(pZip, &file_data_array);
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                }

                local_header_uncomp_size = MZ_READ_LE64(pSrc_field_data);
                local_header_comp_size = MZ_READ_LE64(pSrc_field_data + sizeof(mz_uint64)); /* may be 0 if there's a descriptor */

                found_zip64_ext_data_in_ldir = MZ_TRUE;
                break;
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);

        mz_zip_array_clear(pZip, &file_data_array);
    }

    if (!pState->m_zip64)
    {
        /* Try to detect if the new archive will most likely wind up too big and bail early (+(sizeof(mz_uint32) * 4) is for the optional descriptor which could be present, +64 is a fudge factor). */
        /* We also check when the archive is finalized so this doesn't need to be perfect. */
        mz_uint64 approx_new_archive_size = cur_dst_file_ofs + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + src_archive_bytes_remaining + (sizeof(mz_uint32) * 4) +
                                            pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + 64;

        if (approx_new_archive_size >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
    }

    /* Write dest archive padding */
    if (!mz_zip_writer_write_zeros(pZip, cur_dst_file_ofs, num_alignment_padding_bytes))
        return MZ_FALSE;

    cur_dst_file_ofs += num_alignment_padding_bytes;

    local_dir_header_ofs = cur_dst_file_ofs;
    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }

    /* The original zip's local header+ext block doesn't change, even with zip64, so we can just copy it over to the dest zip */
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_dst_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Copy over the source archive bytes to the dest archive, also ensure we have enough buf space to handle optional data descriptor */
    if (NULL == (pBuf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)MZ_MAX(32U, MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining)))))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    while (src_archive_bytes_remaining)
    {
        n = (mz_uint)MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining);
        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }
        cur_src_file_ofs += n;

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_dst_file_ofs += n;

        src_archive_bytes_remaining -= n;
    }

    /* Now deal with the optional data descriptor */
    bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
    if (bit_flags & 8)
    {
        /* Copy data descriptor */
        if ((pSource_zip->m_pState->m_zip64) || (found_zip64_ext_data_in_ldir))
        {
            /* src is zip64, dest must be zip64 */

            /* name			uint32_t's */
            /* id				1 (optional in zip64?) */
            /* crc			1 */
            /* comp_size	2 */
            /* uncomp_size 2 */
            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, (sizeof(mz_uint32) * 6)) != (sizeof(mz_uint32) * 6))
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            n = sizeof(mz_uint32) * ((MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID) ? 6 : 5);
        }
        else
        {
            /* src is NOT zip64 */
            mz_bool has_id;

            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, sizeof(mz_uint32) * 4) != sizeof(mz_uint32) * 4)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            has_id = (MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID);

            if (pZip->m_pState->m_zip64)
            {
                /* dest is zip64, so upgrade the data descriptor */
                const mz_uint32 *pSrc_descriptor = (const mz_uint32 *)((const mz_uint8 *)pBuf + (has_id ? sizeof(mz_uint32) : 0));
                const mz_uint32 src_crc32 = pSrc_descriptor[0];
                const mz_uint64 src_comp_size = pSrc_descriptor[1];
                const mz_uint64 src_uncomp_size = pSrc_descriptor[2];

                mz_write_le32((mz_uint8 *)pBuf, MZ_ZIP_DATA_DESCRIPTOR_ID);
                mz_write_le32((mz_uint8 *)pBuf + sizeof(mz_uint32) * 1, src_crc32);
                mz_write_le64((mz_uint8 *)pBuf + sizeof(mz_uint32) * 2, src_comp_size);
                mz_write_le64((mz_uint8 *)pBuf + sizeof(mz_uint32) * 4, src_uncomp_size);

                n = sizeof(mz_uint32) * 6;
            }
            else
            {
                /* dest is NOT zip64, just copy it as-is */
                n = sizeof(mz_uint32) * (has_id ? 4 : 3);
            }
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_src_file_ofs += n;
        cur_dst_file_ofs += n;
    }
    pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);

    /* Finally, add the new central dir header */
    orig_central_dir_size = pState->m_central_dir.m_size;

    memcpy(new_central_header, pSrc_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE);

    if (pState->m_zip64)
    {
        /* This is the painful part: We need to write a new central dir header + ext block with updated zip64 fields, and ensure the old fields (if any) are not included. */
        const mz_uint8 *pSrc_ext = pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len;
        mz_zip_array new_ext_block;

        mz_zip_array_init(&new_ext_block, sizeof(mz_uint8));

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, MZ_UINT32_MAX);

        if (!mz_zip_writer_update_zip64_extension_block(&new_ext_block, pZip, pSrc_ext, src_ext_len, &src_file_stat.m_comp_size, &src_file_stat.m_uncomp_size, &local_dir_header_ofs, NULL))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            return MZ_FALSE;
        }

        MZ_WRITE_LE16(new_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS, new_ext_block.m_size);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, src_filename_len))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_ext_block.m_p, new_ext_block.m_size))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len + src_ext_len, src_comment_len))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        mz_zip_array_clear(pZip, &new_ext_block);
    }
    else
    {
        /* sanity checks */
        if (cur_dst_file_ofs > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        if (local_dir_header_ofs >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, local_dir_header_ofs);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, src_central_dir_following_data_size))
        {
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }
    }

    /* This shouldn't trigger unless we screwed up during the initial sanity checks */
    if (pState->m_central_dir.m_size >= MZ_UINT32_MAX)
    {
        /* TODO: Support central dirs >= 32-bits in size */
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);
    }

    n = (mz_uint32)orig_central_dir_size;
    if (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets, &n, 1))
    {
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    pZip->m_total_files++;
    pZip->m_archive_size = cur_dst_file_ofs;

    return MZ_TRUE;
}